

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdfx.c
# Opt level: O2

char * gdImageStringFTCircle
                 (gdImagePtr im,int cx,int cy,double radius,double textRadius,double fillPortion,
                 char *font,double points,char *top,char *bottom,int fgcolor)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  gdImagePtr im_00;
  gdImagePtr dst;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  double dVar19;
  char *local_b0;
  uint local_98;
  int brect [8];
  
  dVar19 = points * 4.0;
  local_b0 = gdImageStringFT((gdImage *)0x0,brect,0,font,dVar19,0.0,0,0,bottom);
  iVar8 = brect[7];
  iVar13 = brect[5];
  iVar7 = brect[3];
  iVar18 = brect[1];
  if (local_b0 == (char *)0x0) {
    iVar6 = brect[6];
    if (brect[6] < brect[4]) {
      iVar6 = brect[4];
    }
    iVar10 = brect[6];
    if (brect[4] < brect[6]) {
      iVar10 = brect[4];
    }
    iVar15 = brect[2];
    if (brect[2] < brect[0]) {
      iVar15 = brect[0];
    }
    iVar1 = brect[2];
    if (brect[0] < brect[2]) {
      iVar1 = brect[0];
    }
    if (iVar15 <= iVar6) {
      iVar15 = iVar6;
    }
    if (iVar10 <= iVar1) {
      iVar1 = iVar10;
    }
    local_b0 = gdImageStringFT((gdImage *)0x0,brect,0,font,dVar19,0.0,0,0,top);
    if (local_b0 == (char *)0x0) {
      uVar16 = iVar15 - iVar1;
      iVar6 = iVar8;
      if (iVar8 < iVar13) {
        iVar6 = iVar13;
      }
      if (iVar13 < iVar8) {
        iVar8 = iVar13;
      }
      iVar13 = iVar7;
      if (iVar7 < iVar18) {
        iVar13 = iVar18;
      }
      if (iVar18 < iVar7) {
        iVar7 = iVar18;
      }
      if (iVar13 <= iVar6) {
        iVar13 = iVar6;
      }
      if (iVar8 <= iVar7) {
        iVar7 = iVar8;
      }
      iVar8 = brect[6];
      if (brect[6] < brect[4]) {
        iVar8 = brect[4];
      }
      if (brect[4] < brect[6]) {
        brect[6] = brect[4];
      }
      iVar18 = brect[2];
      if (brect[2] < brect[0]) {
        iVar18 = brect[0];
      }
      if (brect[0] < brect[2]) {
        brect[2] = brect[0];
      }
      if (iVar18 <= iVar8) {
        iVar18 = iVar8;
      }
      if (brect[6] <= brect[2]) {
        brect[2] = brect[6];
      }
      uVar12 = iVar18 - brect[2];
      iVar8 = brect[7];
      if (brect[7] < brect[5]) {
        iVar8 = brect[5];
      }
      if (brect[5] < brect[7]) {
        brect[7] = brect[5];
      }
      iVar18 = brect[3];
      if (brect[3] < brect[1]) {
        iVar18 = brect[1];
      }
      if (brect[1] < brect[3]) {
        brect[3] = brect[1];
      }
      if (iVar18 <= iVar8) {
        iVar18 = iVar8;
      }
      if (brect[7] <= brect[3]) {
        brect[3] = brect[7];
      }
      iVar8 = uVar12 + 6;
      if ((int)uVar12 < (int)uVar16) {
        iVar8 = uVar16 + 6;
      }
      iVar6 = iVar8 * 2 + 4;
      uVar5 = iVar18 - brect[3];
      if (iVar18 - brect[3] < iVar13 - iVar7) {
        uVar5 = iVar13 - iVar7;
      }
      iVar7 = uVar5 + 6;
      im_00 = gdImageCreateTrueColor(iVar6,iVar7);
      if (im_00 == (gdImagePtr)0x0) {
        local_b0 = "could not create first image";
      }
      else {
        iVar18 = iVar6 >> 1;
        local_b0 = gdImageStringFT(im_00,(int *)0x0,0xffffff,font,dVar19,0.0,
                                   (int)(iVar18 - (uVar16 + 6)) / 2,(int)dVar19,bottom);
        if ((local_b0 == (char *)0x0) &&
           (local_b0 = gdImageStringFT(im_00,(int *)0x0,0xffffff,font,dVar19,0.0,
                                       (int)(iVar18 - (uVar12 + 6)) / 2 + iVar18,(int)dVar19,top),
           local_b0 == (char *)0x0)) {
          iVar8 = iVar8 * 2 + 2;
          if ((uVar5 & 1) == 0) {
            uVar2 = (ulong)uVar16;
            if ((int)uVar16 < (int)uVar12) {
              uVar2 = (ulong)uVar12;
            }
            uVar9 = 0;
            uVar11 = (ulong)(uint)(iVar7 >> 1);
            if (iVar7 >> 1 < 1) {
              uVar11 = uVar9;
            }
            for (; uVar9 != uVar11; uVar9 = uVar9 + 1) {
              iVar13 = ((iVar18 + (int)uVar2 * 2) - ((int)uVar2 * 2 + 0x10 >> 1)) + 0xe;
              for (lVar14 = ((long)((uVar2 << 0x21) + 0x1000000000) >> 0x21) + 2; lVar14 < iVar8;
                  lVar14 = lVar14 + 1) {
                piVar3 = im_00->tpixels[(int)(~(uint)uVar9 + iVar7)];
                iVar10 = piVar3[(long)iVar13 + -1];
                piVar4 = im_00->tpixels[uVar9];
                piVar3[(long)iVar13 + -1] = piVar4[lVar14];
                piVar4[lVar14] = iVar10;
                iVar13 = iVar13 + -1;
              }
            }
          }
          else {
            uVar2 = (ulong)uVar16;
            if ((int)uVar16 < (int)uVar12) {
              uVar2 = (ulong)uVar12;
            }
            iVar10 = (int)((long)iVar7 / 2);
            iVar13 = -1;
            if (-1 < iVar10) {
              iVar13 = iVar10;
            }
            for (uVar11 = 0; uVar11 != iVar13 + 1; uVar11 = uVar11 + 1) {
              iVar10 = 0;
              if (uVar11 == ((long)iVar7 / 2 & 0xffffffffU)) {
                iVar10 = iVar6 / -4;
              }
              iVar15 = ((iVar18 + (int)uVar2 * 2) - ((int)uVar2 * 2 + 0x10 >> 1)) + 0xe;
              for (lVar14 = ((long)((uVar2 << 0x21) + 0x1000000000) >> 0x21) + 2;
                  lVar14 < iVar10 + iVar8; lVar14 = lVar14 + 1) {
                piVar3 = im_00->tpixels[(int)(~(uint)uVar11 + iVar7)];
                iVar1 = piVar3[(long)iVar15 + -1];
                piVar4 = im_00->tpixels[uVar11];
                piVar3[(long)iVar15 + -1] = piVar4[lVar14];
                piVar4[lVar14] = iVar1;
                iVar15 = iVar15 + -1;
              }
            }
          }
          iVar8 = iVar7 * 10;
          if (iVar6 == iVar8 || SBORROW4(iVar6,iVar8) != iVar6 + iVar7 * -10 < 0) {
            iVar6 = iVar8;
          }
          dst = gdImageCreateTrueColor(iVar6,iVar6);
          if (dst == (gdImagePtr)0x0) {
            local_b0 = "could not create resampled image";
          }
          else {
            iVar7 = (int)((1.0 - textRadius / radius) * (double)iVar8);
            iVar8 = (int)((textRadius / radius) * (double)iVar8);
            gdImageCopyResampled
                      (dst,im_00,(int)((1.0 - fillPortion) * (double)dst->sx * 0.25),iVar7,0,0,
                       (int)((double)dst->sx * fillPortion * 0.5),iVar8,im_00->sx / 2,im_00->sy);
            dVar19 = (double)dst->sx;
            iVar18 = im_00->sx / 2;
            gdImageCopyResampled
                      (dst,im_00,(int)((1.0 - fillPortion) * dVar19 * 0.25 + (double)(dst->sx / 2)),
                       iVar7,iVar18,0,(int)(dVar19 * fillPortion * 0.5),iVar8,iVar18,im_00->sy);
            gdImageDestroy(im_00);
            im_00 = gdImageSquareToCircle(dst,(int)radius);
            gdImageDestroy(dst);
            if (im_00 == (gdImagePtr)0x0) {
              return (char *)0x0;
            }
            iVar8 = im_00->sx;
            iVar7 = im_00->sy;
            iVar13 = iVar8 / -2;
            iVar18 = iVar7 / -2;
            local_98 = (uint)~fgcolor >> 0x18 & 0x7f;
            local_b0 = (char *)0x0;
            for (lVar14 = 0; lVar14 < iVar7; lVar14 = lVar14 + 1) {
              for (lVar17 = 0; lVar17 < iVar8; lVar17 = lVar17 + 1) {
                gdImageSetPixel(im,iVar13 + cx + (int)lVar17,iVar18 + cy + (int)lVar14,
                                (fgcolor & 0xffffffU | 0x7f000000) +
                                ((((uint)im_00->tpixels[lVar14][lVar17] >> 0x11 & 0x7f) * local_98)
                                / 0x7f) * -0x1000000);
                iVar8 = im_00->sx;
              }
              iVar7 = im_00->sy;
            }
          }
        }
        gdImageDestroy(im_00);
      }
    }
  }
  return local_b0;
}

Assistant:

BGD_DECLARE(char*)
gdImageStringFTCircle (gdImagePtr im,
                       int cx,
                       int cy,
                       double radius,
                       double textRadius,
                       double fillPortion,
                       char *font,
                       double points, char *top, char *bottom, int fgcolor)
{
	char *err;
	int w;
	int brect[8];
	int sx1, sx2, sy1, sy2, sx, sy;
	int x, y;
	int fr, fg, fb, fa;
	int ox, oy;
	double prop;
	gdImagePtr im1;
	gdImagePtr im2;
	gdImagePtr im3;
	/* obtain brect so that we can size the image */
	err = gdImageStringFT ((gdImagePtr) NULL,
	                       &brect[0], 0, font, points * MAG, 0, 0, 0, bottom);
	if (err) {
		return err;
	}
	sx1 = MAXX (brect) - MINX (brect) + 6;
	sy1 = MAXY (brect) - MINY (brect) + 6;
	err = gdImageStringFT ((gdImagePtr) NULL,
	                       &brect[0], 0, font, points * MAG, 0, 0, 0, top);
	if (err) {
		return err;
	}
	sx2 = MAXX (brect) - MINX (brect) + 6;
	sy2 = MAXY (brect) - MINY (brect) + 6;
	/* Pad by 4 pixels to allow for slight errors
	   observed in the bounding box returned by freetype */
	if (sx1 > sx2) {
		sx = sx1 * 2 + 4;
	} else {
		sx = sx2 * 2 + 4;
	}
	if (sy1 > sy2) {
		sy = sy1;
	} else {
		sy = sy2;
	}
	im1 = gdImageCreateTrueColor (sx, sy);
	if (!im1) {
		return "could not create first image";
	}
	err = gdImageStringFT (im1, 0, gdTrueColor (255, 255, 255),
	                       font, points * MAG,
	                       0, ((sx / 2) - sx1) / 2, points * MAG, bottom);
	if (err) {
		gdImageDestroy (im1);
		return err;
	}
	/* We don't know the descent, which would be needed to do this
	   with the angle parameter. Instead, implement a simple
	   flip operation ourselves. */
	err = gdImageStringFT (im1, 0, gdTrueColor (255, 255, 255),
	                       font, points * MAG,
	                       0, sx / 2 + ((sx / 2) - sx2) / 2, points * MAG, top);
	if (err) {
		gdImageDestroy (im1);
		return err;
	}
	/* Flip in place is tricky, be careful not to double-swap things */
	if (sy & 1) {
		for (y = 0; (y <= (sy / 2)); y++) {
			int xlimit = sx - 2;
			if (y == (sy / 2)) {
				/* If there is a "middle" row, be careful
				   not to swap twice! */
				xlimit -= (sx / 4);
			}
			for (x = (sx / 2) + 2; (x < xlimit); x++) {
				int t;
				int ox = sx - x + (sx / 2) - 1;
				int oy = sy - y - 1;
				t = im1->tpixels[oy][ox];
				im1->tpixels[oy][ox] = im1->tpixels[y][x];
				im1->tpixels[y][x] = t;
			}
		}
	} else {
		for (y = 0; (y < (sy / 2)); y++) {
			int xlimit = sx - 2;
			for (x = (sx / 2) + 2; (x < xlimit); x++) {
				int t;
				int ox = sx - x + (sx / 2) - 1;
				int oy = sy - y - 1;
				t = im1->tpixels[oy][ox];
				im1->tpixels[oy][ox] = im1->tpixels[y][x];
				im1->tpixels[y][x] = t;
			}
		}
	}
#if STEP_PNGS
	{
		FILE *out = fopen ("gdfx1.png", "wb");
		gdImagePng (im1, out);
		fclose (out);
	}
#endif /* STEP_PNGS */
	/* Resample taller; the exact proportions of the text depend on the
	   ratio of textRadius to radius, and the value of fillPortion */
	if (sx > sy * 10) {
		w = sx;
	} else {
		w = sy * 10;
	}
	im2 = gdImageCreateTrueColor (w, w);
	if (!im2) {
		gdImageDestroy (im1);
		return "could not create resampled image";
	}
	prop = textRadius / radius;
	gdImageCopyResampled (im2, im1,
	                      gdImageSX (im2) * (1.0 - fillPortion) / 4,
	                      sy * 10 * (1.0 - prop),
	                      0, 0,
	                      gdImageSX (im2) * fillPortion / 2, sy * 10 * prop,
	                      gdImageSX (im1) / 2, gdImageSY (im1));
	gdImageCopyResampled (im2, im1,
	                      (gdImageSX (im2) / 2) +
	                      gdImageSX (im2) * (1.0 - fillPortion) / 4,
	                      sy * 10 * (1.0 - prop),
	                      gdImageSX (im1) / 2, 0,
	                      gdImageSX (im2) * fillPortion / 2, sy * 10 * prop,
	                      gdImageSX (im1) / 2, gdImageSY (im1));
#if STEP_PNGS
	{
		FILE *out = fopen ("gdfx2.png", "wb");
		gdImagePng (im2, out);
		fclose (out);
	}
#endif /* STEP_PNGS */

	gdImageDestroy (im1);

	/* Ready to produce a circle */
	im3 = gdImageSquareToCircle (im2, radius);
	if (im3 == NULL) {
		gdImageDestroy(im2);
		return 0;
	}
	gdImageDestroy (im2);
	/* Now blend im3 with the destination. Cheat a little. The
	   source (im3) is white-on-black, so we can use the
	   red component as a basis for alpha as long as we're
	   careful to shift off the extra bit and invert
	   (alpha ranges from 0 to 127 where 0 is OPAQUE).
	   Also be careful to allow for an alpha component
	   in the fgcolor parameter itself (gug!) */
	fr = gdTrueColorGetRed (fgcolor);
	fg = gdTrueColorGetGreen (fgcolor);
	fb = gdTrueColorGetBlue (fgcolor);
	fa = gdTrueColorGetAlpha (fgcolor);
	ox = cx - (im3->sx / 2);
	oy = cy - (im3->sy / 2);
	for (y = 0; (y < im3->sy); y++) {
		for (x = 0; (x < im3->sx); x++) {
			int a = gdTrueColorGetRed (im3->tpixels[y][x]) >> 1;
			a *= (127 - fa);
			a /= 127;
			a = 127 - a;
			gdImageSetPixel (im, x + ox, y + oy,
			                 gdTrueColorAlpha (fr, fg, fb, a));
		}
	}
	gdImageDestroy (im3);
	return 0;
}